

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

bool tinyusdz::tydra::anon_unknown_6::ToProperty<tinyusdz::value::color3f>
               (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *input,
               Property *output,string *err)

{
  TypedTimeSamples<tinyusdz::value::color3f> *this;
  undefined8 uVar1;
  pointer pSVar2;
  pointer pPVar3;
  pointer pSVar4;
  pointer pPVar5;
  bool bVar6;
  char cVar7;
  Property *pPVar8;
  storage_t<tinyusdz::Animatable<tinyusdz::value::color3f>_> *psVar9;
  ulong uVar10;
  long lVar11;
  Animatable<tinyusdz::value::color3f> v;
  TimeSamples ts;
  Attribute attr;
  PrimVar pvar;
  undefined1 local_938 [24];
  pointer local_920;
  long local_918;
  char local_910;
  string *local_900;
  Property *local_8f8;
  storage_union local_8f0;
  undefined **local_8e0;
  storage_union local_8d8;
  undefined1 uStack_8c8;
  undefined7 uStack_8c7;
  undefined1 uStack_8c0;
  undefined1 local_8b8 [40];
  _Alloc_hider local_890;
  size_type local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  storage_union local_870;
  vtable_type *local_860;
  bool local_858;
  undefined1 local_850 [32];
  undefined1 local_830 [24];
  AttrMetas AStack_818;
  storage_union local_610;
  undefined **local_600;
  undefined1 local_5f8;
  undefined1 local_5f0 [8];
  string sStack_5e8;
  undefined7 uStack_5e7;
  undefined1 uStack_5e0;
  undefined8 uStack_5df;
  any local_5c8;
  bool local_5b0;
  pointer local_5a8;
  pointer local_5a0;
  pointer local_598;
  bool local_590;
  pointer local_588;
  pointer local_580;
  pointer local_578;
  AttrMetas AStack_570;
  undefined8 local_368;
  Type local_360;
  Path PStack_358;
  pointer local_288;
  pointer local_280;
  pointer local_278;
  ListEditQual local_270;
  AttrMetas AStack_268;
  bool local_60;
  string asStack_58 [32];
  bool local_38;
  
  local_8b8._0_8_ = local_8b8 + 0x10;
  local_8b8._8_8_ = 0;
  local_8b8[0x10] = '\0';
  local_8b8[0x24] = false;
  local_890._M_p = (pointer)&local_880;
  local_888 = 0;
  local_880._M_local_buf[0] = '\0';
  local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_870.dynamic = (void *)0x0;
  local_858 = false;
  local_850._0_8_ = (pointer)0x0;
  local_850[8] = 0;
  local_850._9_7_ = 0;
  local_850[0x10] = 0;
  local_850._17_8_ = 0;
  AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  AStack_818.elementSize.has_value_ = false;
  AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
  AStack_818.hidden.has_value_ = false;
  AStack_818.hidden.contained = (storage_t<bool>)0x0;
  AStack_818.comment.has_value_ = false;
  AStack_818.weight.contained = (storage_t<double>)0x0;
  AStack_818.connectability.has_value_ = false;
  AStack_818.bindMaterialAs.contained._16_8_ = 0;
  AStack_818.bindMaterialAs.contained._24_8_ = 0;
  AStack_818.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.bindMaterialAs.contained._8_8_ = 0;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.comment.contained._8_8_ = 0;
  AStack_818.comment.contained._16_8_ = 0;
  AStack_818.comment.contained._24_8_ = 0;
  AStack_818.comment.contained._32_8_ = 0;
  AStack_818.comment.contained._40_8_ = 0;
  AStack_818.customData.has_value_ = false;
  AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.customData.contained._8_8_ = 0;
  AStack_818.customData.contained._16_8_ = 0;
  AStack_818.customData.contained._24_8_ = 0;
  AStack_818.customData.contained._32_8_ = 0;
  AStack_818.customData.contained._40_8_ = 0;
  AStack_818.weight.has_value_ = false;
  AStack_818.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.connectability.contained._8_8_ = 0;
  AStack_818.connectability.contained._16_8_ = 0;
  AStack_818.connectability.contained._24_8_ = 0;
  AStack_818.outputName.has_value_ = false;
  AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.outputName.contained._8_8_ = 0;
  AStack_818.outputName.contained._16_8_ = 0;
  AStack_818.outputName.contained._24_8_ = 0;
  AStack_818.renderType.has_value_ = false;
  AStack_818.sdrMetadata.has_value_ = false;
  AStack_818.renderType.contained._16_8_ = 0;
  AStack_818.renderType.contained._24_8_ = 0;
  AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.renderType.contained._8_8_ = 0;
  AStack_818.displayName.has_value_ = false;
  AStack_818.sdrMetadata.contained._32_8_ = 0;
  AStack_818.sdrMetadata.contained._40_8_ = 0;
  AStack_818.sdrMetadata.contained._16_8_ = 0;
  AStack_818.sdrMetadata.contained._24_8_ = 0;
  AStack_818.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.sdrMetadata.contained._8_8_ = 0;
  AStack_818.displayGroup.has_value_ = false;
  AStack_818.displayName.contained._16_8_ = 0;
  AStack_818.displayName.contained._24_8_ = 0;
  AStack_818.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.displayName.contained._8_8_ = 0;
  AStack_818.bindMaterialAs.has_value_ = false;
  AStack_818.displayGroup.contained._16_8_ = 0;
  AStack_818.displayGroup.contained._24_8_ = 0;
  AStack_818.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.displayGroup.contained._8_8_ = 0;
  local_830[0x10] = 0;
  stack0xfffffffffffff7e1 = 0;
  local_830._0_8_ = (pointer)0x0;
  local_830[8] = 0;
  local_830._9_7_ = 0;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8b8._32_4_ = Varying;
  local_610._8_8_ = 7;
  local_600 = (undefined **)0x6633726f6c6f63;
  local_8f8 = output;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_610.dynamic = &local_600;
  ::std::__cxx11::string::_M_assign((string *)&local_890);
  if ((undefined ***)local_610.dynamic != &local_600) {
    operator_delete(local_610.dynamic,(long)local_600 + 1);
  }
  if (input->_blocked == true) {
    local_858 = true;
  }
  local_900 = err;
  if ((input->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (input->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&input->_paths);
  }
  psVar9 = (storage_t<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)&input->_fallback;
  if ((input->_attrib).has_value_ != false) {
    psVar9 = &(input->_attrib).contained;
  }
  uVar1 = *(undefined8 *)((long)psVar9 + 6);
  this = (TypedTimeSamples<tinyusdz::value::color3f> *)(local_938 + 0x10);
  local_938._8_4_ = (undefined4)((ulong)uVar1 >> 0x10);
  local_938[0xc] = (char)((ulong)uVar1 >> 0x30);
  local_938[0xd] = (char)((ulong)uVar1 >> 0x38);
  local_938._0_6_ = (undefined6)*(undefined8 *)psVar9;
  local_938._6_2_ = (undefined2)((ulong)*(undefined8 *)psVar9 >> 0x30);
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
  ::vector((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
            *)this,(vector<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
                    *)((long)psVar9 + 0x10));
  local_910 = *(bool *)((long)psVar9 + 0x28);
  local_600 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_610.dynamic = (void *)0x0;
  local_5f8 = 0;
  local_5f0 = (undefined1  [8])0x0;
  sStack_5e8 = (string)0x0;
  uStack_5e7 = 0;
  uStack_5e0 = 0;
  uStack_5df = 0;
  if ((bool)local_910 == true) {
    TypedTimeSamples<tinyusdz::value::color3f>::update(this);
  }
  if (local_920 != (pointer)local_938._16_8_) {
    if (local_910 == '\x01') {
      TypedTimeSamples<tinyusdz::value::color3f>::update(this);
    }
    uStack_8c8 = 0;
    uStack_8c7 = 0;
    uStack_8c0 = 0;
    local_8d8.dynamic = (void *)0x0;
    local_8d8._8_4_ = 0;
    local_8d8._12_4_ = 0;
    if (local_920 != (pointer)local_938._16_8_) {
      lVar11 = 8;
      uVar10 = 0;
      do {
        local_8e0 = &linb::any::vtable_for_type<tinyusdz::value::color3f>()::table;
        local_8f0.dynamic =
             (void *)*(undefined8 *)
                      ((long)&(((string *)local_938._16_8_)->_M_dataplus)._M_p + lVar11);
        local_8f0._8_4_ =
             *(undefined4 *)((long)&((string *)local_938._16_8_)->_M_string_length + lVar11);
        tinyusdz::value::TimeSamples::add_sample
                  ((TimeSamples *)&local_8d8,*(double *)(local_938._16_8_ + lVar11 + -8),
                   (Value *)&local_8f0);
        if (local_8e0 != (undefined **)0x0) {
          (*(code *)local_8e0[4])(&local_8f0);
          local_8e0 = (undefined **)0x0;
        }
        uVar10 = uVar10 + 1;
        lVar11 = lVar11 + 0x18;
      } while (uVar10 < (ulong)(((long)local_920 - local_938._16_8_ >> 3) * -0x5555555555555555));
    }
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)local_5f0,
                (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)&local_8d8);
    uStack_5df = CONCAT17(uStack_8c0,(undefined7)uStack_5df);
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)&local_8d8);
  }
  cVar7 = local_938[0xd];
  if (local_938[0xc] == '\x01') {
    if (local_938[0xd] == '\0') {
      local_8d8._8_4_ = local_938._8_4_;
      local_8d8.dynamic = (void *)CONCAT26(local_938._6_2_,local_938._0_6_);
      uStack_8c8 = 0xf8;
      uStack_8c7 = 0x6d50;
      linb::any::operator=((any *)&local_610,(any *)&local_8d8);
      if (CONCAT71(uStack_8c7,uStack_8c8) != 0) {
        (**(code **)(CONCAT71(uStack_8c7,uStack_8c8) + 0x20))(&local_8d8);
        uStack_8c8 = 0;
        uStack_8c7 = 0;
      }
    }
    else if (local_900 != (string *)0x0) {
      ::std::__cxx11::string::append((char *)local_900);
    }
    if (cVar7 != '\0') {
      bVar6 = false;
      goto LAB_00505dc8;
    }
  }
  Attribute::set_var((Attribute *)local_8b8,(PrimVar *)&local_610);
  bVar6 = true;
LAB_00505dc8:
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_5f0);
  if (local_600 != (undefined **)0x0) {
    (*(code *)local_600[4])(&local_610);
    local_600 = (undefined **)0x0;
  }
  if ((pointer)local_938._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_938._16_8_,local_918 - local_938._16_8_);
  }
  if (bVar6) {
    AttrMetas::operator=(&AStack_818,&input->_metas);
    Property::Property((Property *)&local_610,(Attribute *)local_8b8,false);
    pPVar8 = local_8f8;
    ::std::__cxx11::string::operator=((string *)local_8f8,(string *)&local_610);
    (pPVar8->_attrib)._variability = local_5f0._0_4_;
    (pPVar8->_attrib)._varying_authored = local_5f0[4];
    ::std::__cxx11::string::operator=((string *)&(pPVar8->_attrib)._type_name,&sStack_5e8);
    linb::any::operator=((any *)&(pPVar8->_attrib)._var,&local_5c8);
    (pPVar8->_attrib)._var._blocked = local_5b0;
    pSVar2 = (pPVar8->_attrib)._var._ts._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = *(pointer *)
              ((long)&(pPVar8->_attrib)._var._ts._samples.
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ._M_impl.super__Vector_impl_data + 8);
    local_938._16_8_ =
         *(pointer *)
          ((long)&(pPVar8->_attrib)._var._ts._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data + 0x10);
    (pPVar8->_attrib)._var._ts._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = local_5a8;
    *(pointer *)
     ((long)&(pPVar8->_attrib)._var._ts._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data + 8) = local_5a0;
    *(pointer *)
     ((long)&(pPVar8->_attrib)._var._ts._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data + 0x10) = local_598;
    local_5a8 = (pointer)0x0;
    local_5a0 = (pointer)0x0;
    local_938._0_6_ = SUB86(pSVar2,0);
    local_938._6_2_ = (undefined2)((ulong)pSVar2 >> 0x30);
    local_938._8_4_ = SUB84(pSVar4,0);
    local_938[0xc] = (char)((ulong)pSVar4 >> 0x20);
    local_938[0xd] = (char)((ulong)pSVar4 >> 0x28);
    local_938._14_2_ = (undefined2)((ulong)pSVar4 >> 0x30);
    local_598 = (pointer)0x0;
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)local_938);
    (pPVar8->_attrib)._var._ts._dirty = local_590;
    pPVar3 = (pPVar8->_attrib)._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar5 = (pPVar8->_attrib)._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_938._16_8_ =
         (pPVar8->_attrib)._paths.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (pPVar8->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_start = local_588;
    (pPVar8->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_finish = local_580;
    (pPVar8->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_578;
    local_588 = (pointer)0x0;
    local_580 = (pointer)0x0;
    local_938._0_6_ = SUB86(pPVar3,0);
    local_938._6_2_ = (undefined2)((ulong)pPVar3 >> 0x30);
    local_938._8_4_ = SUB84(pPVar5,0);
    local_938[0xc] = (char)((ulong)pPVar5 >> 0x20);
    local_938[0xd] = (char)((ulong)pPVar5 >> 0x28);
    local_938._14_2_ = (undefined2)((ulong)pPVar5 >> 0x30);
    local_578 = (pointer)0x0;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_938);
    AttrMetas::operator=(&(pPVar8->_attrib)._metas,&AStack_570);
    pPVar8->_listOpQual = (undefined4)local_368;
    pPVar8->_type = local_368._4_4_;
    (pPVar8->_rel).type = local_360;
    Path::operator=(&(pPVar8->_rel).targetPath,&PStack_358);
    pPVar3 = (pPVar8->_rel).targetPathVector.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar5 = (pPVar8->_rel).targetPathVector.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_938._16_8_ =
         (pPVar8->_rel).targetPathVector.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (pPVar8->_rel).targetPathVector.
    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_start = local_288;
    (pPVar8->_rel).targetPathVector.
    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish = local_280;
    (pPVar8->_rel).targetPathVector.
    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_278;
    local_288 = (pointer)0x0;
    local_280 = (pointer)0x0;
    local_938._0_6_ = SUB86(pPVar3,0);
    local_938._6_2_ = (undefined2)((ulong)pPVar3 >> 0x30);
    local_938._8_4_ = SUB84(pPVar5,0);
    local_938[0xc] = (char)((ulong)pPVar5 >> 0x20);
    local_938[0xd] = (char)((ulong)pPVar5 >> 0x28);
    local_938._14_2_ = (undefined2)((ulong)pPVar5 >> 0x30);
    local_278 = (pointer)0x0;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_938);
    (pPVar8->_rel).listOpQual = local_270;
    AttrMetas::operator=(&(pPVar8->_rel)._metas,&AStack_268);
    (pPVar8->_rel)._varying_authored = local_60;
    ::std::__cxx11::string::operator=((string *)&pPVar8->_prop_value_type_name,asStack_58);
    pPVar8->_has_custom = local_38;
    Property::~Property((Property *)&local_610);
  }
  AttrMetas::~AttrMetas(&AStack_818);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_850);
  if (local_860 != (vtable_type *)0x0) {
    (*local_860->destroy)(&local_870);
    local_860 = (vtable_type *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_p != &local_880) {
    operator_delete(local_890._M_p,
                    CONCAT71(local_880._M_allocated_capacity._1_7_,local_880._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
    operator_delete((void *)local_8b8._0_8_,CONCAT71(local_8b8._17_7_,local_8b8[0x10]) + 1);
  }
  return bVar6;
}

Assistant:

bool ToProperty(const TypedAttributeWithFallback<Animatable<T>> &input,
                Property &output, std::string *err) {
#if 0
  if (input.is_blocked()) {
    Attribute attr;
    attr.set_blocked(input.is_blocked());
    attr.variability() = Variability::Uniform;
    attr.set_type_name(value::TypeTraits<T>::type_name());
    output = Property(std::move(attr), /*custom*/ false);
  } else if (input.is_value_empty()) {
    // type info only
    Property p;
    p.set_property_type(Property::Type::EmptyAttrib);
    p.attribute().set_type_name(value::TypeTraits<T>::type_name());
    p.set_custom(false);
    output = p;
  } else if (input.is_connection()) {
    // Use Relation for Connection(as typed relationshipTarget)
    // Single connection targetPath only.
    Relationship rel;
    std::vector<Path> pv = input.get_connections();
    if (pv.empty()) {
      DCOUT("??? Empty connectionTarget.");
      if (err) {
        (*err) += "[InternalError] Empty connectionTarget.";
      }
      return false;
    }
    if (pv.size() == 1) {
      DCOUT("targetPath = " << pv[0]);
      output = Property(pv[0], /* type */ value::TypeTraits<T>::type_name(),
                        /* custom */ false);
    } else if (pv.size() > 1) {
      output = Property(pv, /* type */ value::TypeTraits<T>::type_name(),
                        /* custom */ false);
    } else {
      DCOUT("??? GetConnection faile.");
      if (err) {
        (*err) += "[InternalError] Invalid connectionTarget.";
      }
      return false;
    }

  } else {
    // Includes !authored()
    // FIXME: Currently scalar only.
    Animatable<T> v = input.get_value();

    primvar::PrimVar pvar;

    if (v.is_timesamples()) {
      value::TimeSamples ts = ToTypelessTimeSamples(v.get_timesamples());
      pvar.set_timesamples(ts);
    } else if (v.is_scalar()) {
      T a;
      if (v.get_scalar(&a)) {
        value::Value val(a);
        pvar.set_value(val);
      } else {
        DCOUT("??? Invalid Animatable value.");
        if (err) {
          (*err) += "[InternalError] Invalid Animatable value.";
        }
        return false;
      }
    } else {
      DCOUT("??? Invalid Animatable value.");
      if (err) {
        (*err) += "[InternalError] Invalid Animatable value.";
      }
      return false;
    }

    Attribute attr;
    attr.set_var(std::move(pvar));
    attr.variability() = Variability::Varying;
    output = Property(attr, /* custom */ false);
  }
#else

  Attribute attr;
  attr.variability() = Variability::Varying;
  attr.set_type_name(value::TypeTraits<T>::type_name());

  DCOUT("has_connections " << input.has_connections());

  if (input.is_blocked()) {
    attr.set_blocked(input.is_blocked());
  }

  if (input.has_connections()) {
    attr.set_connections(input.get_connections());
  }

  {
    // Includes !authored()
    // FIXME: Currently scalar only.
    Animatable<T> v = input.get_value();

    primvar::PrimVar pvar;
    DCOUT("has_timesamples " << v.has_timesamples());
    DCOUT("has_value " << v.has_value());

    if (v.has_timesamples()) {
      value::TimeSamples ts = ToTypelessTimeSamples(v.get_timesamples());
      pvar.set_timesamples(ts);
    }

    if (v.has_value()) {
      T a;
      if (v.get_scalar(&a)) {
        value::Value val(a);
        pvar.set_value(val);
      } else {
        DCOUT("??? Invalid Animatable value.");
        if (err) {
          (*err) += "[InternalError] Invalid Animatable value.";
        }
        return false;
      }
    }

    attr.set_var(std::move(pvar));
  }

  attr.metas() = input.metas();

  output = Property(std::move(attr), /* custom */ false);

#endif

  return true;
}